

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O2

int __thiscall Snes_Spc::cpu_read_smp_reg(Snes_Spc *this,int reg,rel_time_t time)

{
  int iVar1;
  
  if (1 < reg - 2U) {
    return (int)(this->m).smp_regs[1][reg];
  }
  if (reg - 2U == 1) {
    iVar1 = dsp_read(this,time);
    return iVar1;
  }
  return (int)(this->m).smp_regs[0][2];
}

Assistant:

inline int Snes_Spc::cpu_read_smp_reg( int reg, rel_time_t time )
{
	int result = REGS_IN [reg];
	reg -= r_dspaddr;
	// DSP addr and data
	if ( (unsigned) reg <= 1 ) // 4% 0xF2 and 0xF3
	{
		result = REGS [r_dspaddr];
		if ( (unsigned) reg == 1 )
			result = dsp_read( time ); // 0xF3
	}
	return result;
}